

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

iterator * __thiscall pstack::Elf::Notes::iterator::operator++(iterator *this)

{
  ulong uVar1;
  long lVar2;
  Elf64_Phdr *pEVar3;
  long lVar4;
  
  lVar2 = (ulong)(this->curNote).n_namesz + this->offset;
  uVar1 = (ulong)((int)lVar2 + 0xcU & 3);
  lVar4 = 4 - uVar1;
  if (uVar1 == 0) {
    lVar4 = 0;
  }
  lVar4 = lVar2 + (ulong)(this->curNote).n_descsz + 0xc + lVar4;
  uVar1 = (ulong)((uint)lVar4 & 3);
  lVar2 = 4 - uVar1;
  if (uVar1 == 0) {
    lVar2 = 0;
  }
  uVar1 = lVar2 + lVar4;
  pEVar3 = (this->phdrsi)._M_current;
  if (uVar1 < pEVar3->p_filesz) {
    this->offset = uVar1;
  }
  else {
    pEVar3 = pEVar3 + 1;
    (this->phdrsi)._M_current = pEVar3;
    if (pEVar3 == (Elf64_Phdr *)
                  (this->phdrs->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
      this->offset = 0;
      return this;
    }
    startSection(this);
  }
  readNote(this);
  return this;
}

Assistant:

Notes::iterator &Notes::iterator::operator++()
{
    auto newOff = offset;
    newOff += sizeof curNote + curNote.n_namesz;
    newOff = roundup2(newOff, 4);
    newOff += curNote.n_descsz;
    newOff = roundup2(newOff, 4);
    if (newOff >= phdrsi->p_filesz) {
        if (++phdrsi == phdrs.end()) {
            offset = 0;
            return *this;
        }
        startSection();
    } else {
        offset = newOff;
    }
    readNote();
    return *this;
}